

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

char16 * __thiscall Js::ConcatStringBuilder::GetSz(ConcatStringBuilder *this)

{
  char16 *pcVar1;
  ConcatStringBuilder **ppCVar2;
  ConcatStringBuilder *local_20;
  ConcatStringBuilder *current;
  char16 *sz;
  ConcatStringBuilder *this_local;
  
  pcVar1 = ConcatStringBase::GetSzImpl<Js::ConcatStringBuilder>(&this->super_ConcatStringBase);
  local_20 = this;
  while (local_20 != (ConcatStringBuilder *)0x0) {
    Memory::ClearArray<Memory::WriteBarrierPtr<Js::JavascriptString>>
              (&local_20->m_slots,(long)local_20->m_count);
    ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_ConcatStringBuilder__
                        ((WriteBarrierPtr *)&local_20->m_prevChunk);
    local_20 = *ppCVar2;
  }
  LiteralStringWithPropertyStringPtr::ConvertString<Js::ConcatStringBuilder>(this);
  return pcVar1;
}

Assistant:

const char16 * ConcatStringBuilder::GetSz()
    {
        const char16 * sz = GetSzImpl<ConcatStringBuilder>();

        // Allow a/b to be garbage collected if no more refs.
        ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            ClearArray(current->m_slots, current->m_count);
            current = current->m_prevChunk;
        }

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }